

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnviewgrip.cpp
# Opt level: O3

void __thiscall QColumnViewGrip::mousePressEvent(QColumnViewGrip *this,QMouseEvent *event)

{
  long lVar1;
  bool bVar2;
  double dVar3;
  
  lVar1 = *(long *)(this + 8);
  dVar3 = (double)QEventPoint::globalPosition();
  dVar3 = (double)((ulong)dVar3 & 0x8000000000000000 | (ulong)DAT_006605c0) + dVar3;
  bVar2 = 2147483647.0 < dVar3;
  if (dVar3 <= -2147483648.0) {
    dVar3 = -2147483648.0;
  }
  *(int *)(lVar1 + 0x254) =
       (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar3);
  event[0xc] = (QMouseEvent)0x1;
  return;
}

Assistant:

void QColumnViewGrip::mousePressEvent(QMouseEvent *event)
{
    Q_D(QColumnViewGrip);
    d->originalXLocation = event->globalPosition().toPoint().x();
    event->accept();
}